

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecPushInt(Vec_Vec_t *p,int Level,int Entry)

{
  int iVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = p->nSize;
  if (iVar4 <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(p->pArray,(long)iVar1 << 3);
        iVar4 = p->nSize;
      }
      p->pArray = ppvVar2;
      p->nCap = iVar1;
    }
    for (lVar5 = (long)iVar4; lVar5 <= Level; lVar5 = lVar5 + 1) {
      pVVar3 = Vec_IntAlloc(0);
      p->pArray[lVar5] = pVVar3;
    }
    p->nSize = iVar1;
  }
  pVVar3 = Vec_VecEntryInt(p,Level);
  Vec_IntPush(pVVar3,Entry);
  return;
}

Assistant:

static inline void Vec_VecPushInt( Vec_Vec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_IntAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_VecEntryInt(p, Level), Entry );
}